

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

char * arangodb::velocypack::Exception::message(ExceptionType type)

{
  ExceptionType type_local;
  char *local_8;
  
  if (type == InternalError) {
    local_8 = "Internal error";
  }
  else if (type == NotImplemented) {
    local_8 = "Not implemented";
  }
  else if (type == NoJsonEquivalent) {
    local_8 = "Type has no equivalent in JSON";
  }
  else if (type == ParseError) {
    local_8 = "Parse error";
  }
  else if (type == UnexpectedControlCharacter) {
    local_8 = "Unexpected control character";
  }
  else if (type == IndexOutOfBounds) {
    local_8 = "Index out of bounds";
  }
  else if (type == NumberOutOfRange) {
    local_8 = "Number out of range";
  }
  else if (type == InvalidUtf8Sequence) {
    local_8 = "Invalid UTF-8 sequence";
  }
  else if (type == InvalidAttributePath) {
    local_8 = "Invalid attribute path";
  }
  else if (type == InvalidValueType) {
    local_8 = "Invalid value type for operation";
  }
  else if (type == DuplicateAttributeName) {
    local_8 = "Duplicate attribute name";
  }
  else if (type == NeedCustomTypeHandler) {
    local_8 = "Cannot execute operation without custom type handler";
  }
  else if (type == NeedAttributeTranslator) {
    local_8 = "Cannot execute operation without attribute translator";
  }
  else if (type == CannotTranslateKey) {
    local_8 = "Cannot translate key";
  }
  else if (type == KeyNotFound) {
    local_8 = "Key not found";
  }
  else if (type == BadTupleSize) {
    local_8 = "Array size does not match tuple size";
  }
  else if (type == TooDeepNesting) {
    local_8 = "Too deep nesting in Array/Object";
  }
  else if (type == BuilderNotSealed) {
    local_8 = "Builder value not yet sealed";
  }
  else if (type == BuilderNeedOpenObject) {
    local_8 = "Need open Object";
  }
  else if (type == BuilderNeedOpenArray) {
    local_8 = "Need open Array";
  }
  else if (type == BuilderNeedOpenCompound) {
    local_8 = "Need open compound value (Array or Object)";
  }
  else if (type == BuilderUnexpectedType) {
    local_8 = "Unexpected type";
  }
  else if (type == BuilderUnexpectedValue) {
    local_8 = "Unexpected value";
  }
  else if (type == BuilderNeedSubvalue) {
    local_8 = "Need subvalue in current Object or Array";
  }
  else if (type == BuilderExternalsDisallowed) {
    local_8 = "Externals are not allowed in this configuration";
  }
  else if (type == BuilderKeyAlreadyWritten) {
    local_8 = "The key of the next key/value pair is already written";
  }
  else if (type == BuilderKeyMustBeString) {
    local_8 = "The key of the next key/value pair must be a string";
  }
  else if (type == BuilderCustomDisallowed) {
    local_8 = "Custom types are not allowed in this configuration";
  }
  else if (type == BuilderTagsDisallowed) {
    local_8 = "Tagged types are not allowed in this configuration";
  }
  else if (type == BuilderBCDDisallowed) {
    local_8 = "BCD types are not allowed in this configuration";
  }
  else if (type == ValidatorInvalidLength) {
    local_8 = "Invalid length found in binary data";
  }
  else if (type == ValidatorInvalidType) {
    local_8 = "Invalid type found in binary data";
  }
  else {
    local_8 = "Unknown error";
  }
  return local_8;
}

Assistant:

char const* Exception::message(ExceptionType type) noexcept {
  switch (type) {
    case InternalError:
      return "Internal error";
    case NotImplemented:
      return "Not implemented";
    case NoJsonEquivalent:
      return "Type has no equivalent in JSON";
    case ParseError:
      return "Parse error";
    case UnexpectedControlCharacter:
      return "Unexpected control character";
    case DuplicateAttributeName:
      return "Duplicate attribute name";
    case IndexOutOfBounds:
      return "Index out of bounds";
    case NumberOutOfRange:
      return "Number out of range";
    case InvalidUtf8Sequence:
      return "Invalid UTF-8 sequence";
    case InvalidAttributePath:
      return "Invalid attribute path";
    case InvalidValueType:
      return "Invalid value type for operation";
    case NeedCustomTypeHandler:
      return "Cannot execute operation without custom type handler";
    case NeedAttributeTranslator:
      return "Cannot execute operation without attribute translator";
    case CannotTranslateKey:
      return "Cannot translate key";
    case KeyNotFound:
      return "Key not found";
    case BadTupleSize:
      return "Array size does not match tuple size";
    case TooDeepNesting:
      return "Too deep nesting in Array/Object";
    case BuilderNotSealed:
      return "Builder value not yet sealed";
    case BuilderNeedOpenObject:
      return "Need open Object";
    case BuilderNeedOpenArray:
      return "Need open Array";
    case BuilderNeedSubvalue:
      return "Need subvalue in current Object or Array";
    case BuilderNeedOpenCompound:
      return "Need open compound value (Array or Object)";
    case BuilderUnexpectedType:
      return "Unexpected type";
    case BuilderUnexpectedValue:
      return "Unexpected value";
    case BuilderExternalsDisallowed:
      return "Externals are not allowed in this configuration";
    case BuilderKeyAlreadyWritten:
      return "The key of the next key/value pair is already written";
    case BuilderKeyMustBeString:
      return "The key of the next key/value pair must be a string";
    case BuilderCustomDisallowed:
      return "Custom types are not allowed in this configuration";
    case BuilderTagsDisallowed:
      return "Tagged types are not allowed in this configuration";
    case BuilderBCDDisallowed:
      return "BCD types are not allowed in this configuration";

    case ValidatorInvalidType:
      return "Invalid type found in binary data";
    case ValidatorInvalidLength:
      return "Invalid length found in binary data";

    case UnknownError:
    default:
      return "Unknown error";
  }
}